

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_parser_parseMessageWithoutReceiver(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  size_t endIndex;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 4) {
    startIndex = state->tokenPosition;
    sVar2 = sysbvm_stringStream_create(context);
    sVar3 = sysbvm_orderedCollection_create(context);
    endIndex = startIndex;
    while( true ) {
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 != 4) break;
      sVar4 = sysbvm_parser_lookAt(state,0);
      sVar4 = sysbvm_token_getValue(sVar4);
      sysbvm_stringStream_nextPutString(context,sVar2,sVar4);
      endIndex = state->tokenPosition + 1;
      state->tokenPosition = endIndex;
      sVar4 = sysbvm_parser_parseBinaryExpression(context,state);
      sysbvm_orderedCollection_add(context,sVar3,sVar4);
    }
    sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,startIndex,endIndex);
    sVar2 = sysbvm_stringStream_asSymbol(context,sVar2);
    sVar2 = sysbvm_astIdentifierReferenceNode_create(context,sVar4,sVar2);
    sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,startIndex,
                       state->tokenPosition);
    sVar3 = sysbvm_orderedCollection_asArray(context,sVar3);
    sVar2 = sysbvm_astUnexpandedApplicationNode_create(context,sVar4,sVar2,sVar3);
    return sVar2;
  }
  sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
  sVar2 = sysbvm_astErrorNode_createWithCString(context,sVar2,"Expected a subscript left bracket.");
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseMessageWithoutReceiver(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_KEYWORD)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a subscript left bracket.");
    
    size_t startPosition = state->tokenPosition;
    size_t keywordEndPosition = state->tokenPosition;
    sysbvm_tuple_t selectorBuilder = sysbvm_stringStream_create(context);
    sysbvm_tuple_t argumentOrderedCollection = sysbvm_orderedCollection_create(context);
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_KEYWORD)
    {
        sysbvm_stringStream_nextPutString(context, selectorBuilder, sysbvm_token_getValue(sysbvm_parser_lookAt(state, 0)));
        ++state->tokenPosition;
        keywordEndPosition = state->tokenPosition;

        sysbvm_tuple_t argument = sysbvm_parser_parseBinaryExpression(context, state);
        sysbvm_orderedCollection_add(context, argumentOrderedCollection, argument);
    }

    sysbvm_tuple_t keywordSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, keywordEndPosition);
    sysbvm_tuple_t functionExpression = sysbvm_astIdentifierReferenceNode_create(context, keywordSourcePosition, sysbvm_stringStream_asSymbol(context, selectorBuilder));

    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);
    return sysbvm_astUnexpandedApplicationNode_create(context, sourcePosition, functionExpression, sysbvm_orderedCollection_asArray(context, argumentOrderedCollection));
}